

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
rangeless::fn::impl::to<std::set<int,std::less<int>,std::allocator<int>>>::operator()
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          to<std::set<int,std::less<int>,std::allocator<int>>> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src)

{
  pointer pXVar1;
  to<std::set<int,std::less<int>,std::allocator<int>>> *in_RAX;
  X *x;
  pointer __v;
  _Alloc_node local_38;
  
  __v = (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pXVar1 = (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_t =
       (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)in_RAX;
  if (__v != pXVar1) {
    do {
      local_38._M_t =
           (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)this;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this,
                 (_Base_ptr)(this + 8),&__v->value,&local_38);
      __v = __v + 1;
    } while (__v != pXVar1);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,
             (_Rb_tree_header *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Iterable src) && // rvalue-specific because dest will be moved-from
        {
#if 0
            // won't compile with std::set
            dest.insert(dest.end(),
                        std::make_move_iterator(src.begin()),
                        std::make_move_iterator(src.end()));
#else
            for(auto&& x : src) {
                dest.insert(dest.end(), std::move(x));
            }       
#endif
            return std::move(dest);
        }